

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.hpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::call_abort(session_impl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  type alloc;
  shared_ptr<libtorrent::aux::session_impl> ptr;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  allocating_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__session_impl_hpp:352:41),_72UL,_(libtorrent::aux::HandlerName)4>
  local_48;
  io_context *local_28;
  handler_storage<72UL,_(libtorrent::aux::HandlerName)4> *local_20;
  undefined4 local_18;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::session_impl,void>
            ((__shared_ptr<libtorrent::aux::session_impl,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libtorrent::aux::session_impl>);
  local_28 = this->m_io_context;
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  local_48.storage = &this->m_abort_handler_storage;
  local_48.error_handler = &this->super_error_handler_interface;
  local_48.handler.ptr.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_58;
  local_48.handler.ptr.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_50;
  local_18 = 0;
  local_20 = local_48.storage;
  boost::asio::io_context::
  basic_executor_type<libtorrent::aux::handler_allocator<int,72ul,(libtorrent::aux::HandlerName)4>,0u>
  ::
  execute<libtorrent::aux::allocating_handler<libtorrent::aux::session_impl::call_abort()::_lambda()_1_,72ul,(libtorrent::aux::HandlerName)4>>
            ((basic_executor_type<libtorrent::aux::handler_allocator<int,72ul,(libtorrent::aux::HandlerName)4>,0u>
              *)&local_28,&local_48);
  if (local_48.handler.ptr.
      super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.handler.ptr.
               super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return;
}

Assistant:

void call_abort()
			{
				auto ptr = shared_from_this();
				dispatch(m_io_context, make_handler([ptr] { ptr->abort(); }
					, m_abort_handler_storage, *this));
			}